

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O3

int vorbis_decode_packet(vorb *f,int *len,int *p_left,int *p_right)

{
  Floor *pFVar1;
  float fVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  ushort uVar7;
  int iVar8;
  int32 n;
  Floor *pFVar9;
  int16 *piVar10;
  float *pfVar11;
  short *psVar12;
  uint uVar13;
  int iVar14;
  uint32 uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  uint8 *puVar21;
  long lVar22;
  ulong uVar23;
  short sVar24;
  ulong uVar25;
  byte *pbVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar34;
  long lVar35;
  long lVar36;
  float *a;
  float *pfVar37;
  int iVar38;
  uint uVar39;
  int iVar40;
  int iVar41;
  Codebook *pCVar42;
  bool bVar43;
  float fVar44;
  float fVar45;
  int n2;
  int right_end;
  int mode;
  int left_end;
  float *residue_buffers [16];
  int really_zero_channel [256];
  int zero_channel [256];
  int local_9d0;
  int local_9cc;
  int *local_9c8;
  int local_9bc;
  float *local_9b8 [16];
  uint8 local_938 [256];
  undefined4 local_838;
  int local_438 [258];
  ulong uVar33;
  
  iVar14 = vorbis_decode_initial(f,p_left,&local_9bc,p_right,&local_9d0,&local_9cc);
  if (iVar14 == 0) {
    return 0;
  }
  lVar20 = (long)local_9cc;
  iVar14 = *p_left;
  iVar19 = *p_right;
  iVar8 = f->blocksize[f->mode_config[lVar20].blockflag];
  puVar21 = f->mapping->submap_floor + ((ulong)((uint)f->mode_config[lVar20].mapping * 0x30) - 0x11)
  ;
  lVar29 = (long)f->channels;
  local_9c8 = p_left;
  if (0 < lVar29) {
    lVar35 = 0;
    do {
      bVar3 = *(byte *)(*(long *)(puVar21 + 8) + 2 + lVar35 * 3);
      local_438[lVar35] = 0;
      uVar25 = (ulong)puVar21[(ulong)bVar3 + 0x11];
      if (f->floor_types[uVar25] == 0) {
        f->error = VORBIS_invalid_stream;
        return 0;
      }
      pFVar9 = f->floor_config;
      uVar15 = get_bits(f,1);
      if (uVar15 == 0) {
LAB_0011ebd9:
        local_438[lVar35] = 1;
      }
      else {
        pFVar1 = pFVar9 + uVar25;
        n = *(int32 *)("" + (ulong)(pFVar1->floor1).floor1_multiplier * 4 + 0xc);
        piVar10 = f->finalY[lVar35];
        iVar16 = ilog(n);
        uVar15 = get_bits(f,iVar16 + -1);
        *piVar10 = (int16)uVar15;
        uVar15 = get_bits(f,iVar16 + -1);
        piVar10[1] = (int16)uVar15;
        if ((pFVar1->floor0).order != '\0') {
          lVar29 = 2;
          uVar32 = 0;
          do {
            bVar3 = *(byte *)((long)pFVar1 + uVar32 + 1);
            uVar33 = (ulong)bVar3;
            uVar18 = (uint)*(byte *)((long)pFVar1 + uVar33 + 0x21);
            bVar4 = *(byte *)((long)pFVar1 + uVar33 + 0x31);
            if (bVar4 == 0) {
              uVar30 = 0;
            }
            else {
              pCVar42 = f->codebooks + *(byte *)((long)pFVar1 + uVar33 + 0x41);
              if (f->valid_bits < 10) {
                if (f->valid_bits == 0) {
                  f->acc = 0;
                }
                do {
                  if (((f->last_seg != 0) && (f->bytes_in_seg == '\0')) ||
                     (iVar16 = get8_packet_raw(f), iVar16 == -1)) break;
                  iVar17 = f->valid_bits;
                  f->acc = f->acc + (iVar16 << ((byte)iVar17 & 0x1f));
                  f->valid_bits = iVar17 + 8;
                } while (iVar17 < 0x11);
              }
              sVar24 = pCVar42->fast_huffman[f->acc & 0x3ff];
              if (sVar24 < 0) {
                uVar30 = codebook_decode_scalar_raw(f,pCVar42);
              }
              else {
                bVar5 = pCVar42->codeword_lengths[(int)sVar24];
                f->acc = f->acc >> (bVar5 & 0x1f);
                iVar16 = f->valid_bits - (uint)bVar5;
                bVar43 = iVar16 < 0;
                if (iVar16 < 1) {
                  iVar16 = 0;
                }
                uVar30 = (int)sVar24;
                if (bVar43) {
                  uVar30 = 0xffffffff;
                }
                f->valid_bits = iVar16;
              }
              if (pCVar42->sparse != '\0') {
                uVar30 = pCVar42->sorted_values[(int)uVar30];
              }
            }
            if (uVar18 != 0) {
              lVar29 = (long)(int)lVar29;
              uVar39 = 0;
              do {
                lVar22 = (long)*(short *)((long)pFVar1 +
                                         (ulong)(uVar30 & ~(-1 << (bVar4 & 0x1f))) * 2 +
                                         (ulong)bVar3 * 0x10 + 0x52);
                uVar30 = (int)uVar30 >> (bVar4 & 0x1f);
                if (lVar22 < 0) {
                  iVar16 = 0;
                }
                else {
                  pCVar42 = f->codebooks + lVar22;
                  if (f->valid_bits < 10) {
                    if (f->valid_bits == 0) {
                      f->acc = 0;
                    }
                    do {
                      if (((f->last_seg != 0) && (f->bytes_in_seg == '\0')) ||
                         (iVar16 = get8_packet_raw(f), iVar16 == -1)) break;
                      iVar17 = f->valid_bits;
                      f->acc = f->acc + (iVar16 << ((byte)iVar17 & 0x1f));
                      f->valid_bits = iVar17 + 8;
                    } while (iVar17 < 0x11);
                  }
                  iVar16 = (int)pCVar42->fast_huffman[f->acc & 0x3ff];
                  if (pCVar42->fast_huffman[f->acc & 0x3ff] < 0) {
                    iVar16 = codebook_decode_scalar_raw(f,pCVar42);
                  }
                  else {
                    bVar5 = pCVar42->codeword_lengths[iVar16];
                    f->acc = f->acc >> (bVar5 & 0x1f);
                    iVar27 = f->valid_bits - (uint)bVar5;
                    iVar17 = iVar27;
                    if (iVar27 < 1) {
                      iVar17 = 0;
                    }
                    if (iVar27 < 0) {
                      iVar16 = -1;
                    }
                    f->valid_bits = iVar17;
                  }
                  if (pCVar42->sparse != '\0') {
                    iVar16 = pCVar42->sorted_values[iVar16];
                  }
                }
                piVar10[lVar29] = (int16)iVar16;
                lVar29 = lVar29 + 1;
                uVar39 = uVar39 + 1;
              } while (uVar39 != uVar18);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 < (pFVar1->floor0).order);
        }
        if (f->valid_bits == -1) goto LAB_0011ebd9;
        local_838._0_2_ = 0x101;
        uVar18 = (pFVar1->floor1).values;
        if (2 < (int)uVar18) {
          lVar29 = 0;
          do {
            bVar3 = *(byte *)((long)pFVar9 + lVar29 * 2 + uVar25 * 0x63c + 0x444);
            bVar4 = *(byte *)((long)pFVar9 + lVar29 * 2 + uVar25 * 0x63c + 0x445);
            uVar6 = *(ushort *)((long)pFVar9 + lVar29 * 2 + uVar25 * 0x63c + 0x156);
            uVar18 = (uint)*(ushort *)((long)pFVar1 + (ulong)((uint)bVar3 + (uint)bVar3) + 0x152);
            uVar7 = *(ushort *)((long)pFVar1 + (ulong)((uint)bVar4 + (uint)bVar4) + 0x152);
            iVar40 = (int)*(short *)((long)piVar10 + (ulong)((uint)bVar3 + (uint)bVar3));
            iVar27 = (int)*(short *)((long)piVar10 + (ulong)((uint)bVar4 + (uint)bVar4));
            iVar16 = SDL_abs(iVar27 - iVar40);
            iVar17 = (int)(iVar16 * (uVar6 - uVar18)) / (int)(uVar7 - uVar18);
            iVar16 = -iVar17;
            if (-1 < iVar27 - iVar40) {
              iVar16 = iVar17;
            }
            iVar16 = iVar16 + iVar40;
            sVar24 = piVar10[lVar29 + 2];
            uVar18 = (uint)sVar24;
            if (sVar24 == 0) {
              *(undefined1 *)((long)&local_838 + lVar29 + 2) = 0;
LAB_0011eb70:
              sVar24 = (short)iVar16;
LAB_0011eb7a:
              piVar10[lVar29 + 2] = sVar24;
            }
            else {
              iVar27 = n - iVar16;
              iVar17 = iVar16;
              if (iVar27 < iVar16) {
                iVar17 = iVar27;
              }
              *(undefined1 *)((long)&local_838 + (ulong)bVar4) = 1;
              *(undefined1 *)((long)&local_838 + (ulong)bVar3) = 1;
              *(undefined1 *)((long)&local_838 + lVar29 + 2) = 1;
              if ((int)uVar18 < iVar17 * 2) {
                if ((uVar18 & 1) == 0) {
                  iVar16 = iVar16 + (uVar18 >> 1);
                }
                else {
                  iVar16 = iVar16 - (uVar18 + 1 >> 1);
                }
                goto LAB_0011eb70;
              }
              if (iVar27 <= iVar16) {
                sVar24 = ((short)iVar16 - sVar24) + (short)iVar27 + -1;
                goto LAB_0011eb7a;
              }
            }
            uVar18 = (pFVar1->floor1).values;
            lVar22 = lVar29 + 3;
            lVar29 = lVar29 + 1;
          } while (lVar22 < (int)uVar18);
        }
        if (0 < (int)uVar18) {
          uVar25 = 0;
          do {
            if (*(char *)((long)&local_838 + uVar25) == '\0') {
              piVar10[uVar25] = -1;
            }
            uVar25 = uVar25 + 1;
          } while (uVar18 != uVar25);
        }
      }
      lVar35 = lVar35 + 1;
      lVar29 = (long)f->channels;
    } while (lVar35 < lVar29);
  }
  SDL_memcpy(&local_838,local_438,lVar29 << 2);
  uVar25 = (ulong)*(ushort *)puVar21;
  if (uVar25 != 0) {
    lVar29 = *(long *)(puVar21 + 8);
    lVar35 = 0;
    do {
      bVar3 = *(byte *)(lVar29 + lVar35);
      if (local_438[bVar3] == 0) {
        uVar32 = (ulong)*(byte *)(lVar29 + 1 + lVar35);
LAB_0011ec59:
        local_438[uVar32] = 0;
        local_438[bVar3] = 0;
      }
      else {
        uVar32 = (ulong)*(byte *)(lVar29 + 1 + lVar35);
        if (local_438[uVar32] == 0) goto LAB_0011ec59;
      }
      lVar35 = lVar35 + 3;
    } while (uVar25 * 3 != lVar35);
  }
  uVar18 = iVar8 >> 1;
  if (puVar21[0x10] != '\0') {
    uVar25 = 0;
    do {
      iVar16 = f->channels;
      iVar17 = 0;
      if (0 < (long)iVar16) {
        pbVar26 = (byte *)(*(long *)(puVar21 + 8) + 2);
        lVar29 = 0;
        iVar17 = 0;
        do {
          if (uVar25 == *pbVar26) {
            if (local_438[lVar29] == 0) {
              pfVar37 = f->channel_buffers[lVar29];
            }
            else {
              pfVar37 = (float *)0x0;
            }
            local_938[iVar17] = local_438[lVar29] != 0;
            local_9b8[iVar17] = pfVar37;
            iVar17 = iVar17 + 1;
          }
          lVar29 = lVar29 + 1;
          pbVar26 = pbVar26 + 3;
        } while (iVar16 != lVar29);
      }
      decode_residue(f,local_9b8,iVar17,uVar18,(uint)puVar21[uVar25 + 0x20],local_938);
      uVar25 = uVar25 + 1;
    } while (uVar25 < puVar21[0x10]);
    uVar25 = (ulong)*(ushort *)puVar21;
  }
  if ((short)uVar25 != 0) {
    lVar29 = *(long *)(puVar21 + 8);
    do {
      if (0 < (int)uVar18) {
        lVar35 = (uVar25 - 1) * 3;
        pfVar37 = f->channel_buffers[*(byte *)(lVar29 + lVar35)];
        pfVar11 = f->channel_buffers[*(byte *)(lVar29 + 1 + lVar35)];
        uVar32 = 0;
        do {
          fVar45 = pfVar37[uVar32];
          fVar2 = pfVar11[uVar32];
          fVar44 = fVar45;
          if (fVar45 <= 0.0) {
            if (fVar2 <= 0.0) {
              fVar44 = fVar45 - fVar2;
            }
            else {
              fVar45 = fVar2 + fVar45;
            }
          }
          else if (fVar2 <= 0.0) {
            fVar44 = fVar2 + fVar45;
          }
          else {
            fVar45 = fVar45 - fVar2;
          }
          pfVar37[uVar32] = fVar44;
          pfVar11[uVar32] = fVar45;
          uVar32 = uVar32 + 1;
        } while (uVar18 != uVar32);
      }
      bVar43 = 1 < (long)uVar25;
      uVar25 = uVar25 - 1;
    } while (bVar43);
  }
  if (0 < f->channels) {
    lVar29 = 0;
    do {
      pfVar37 = f->channel_buffers[lVar29];
      if ((&local_838)[lVar29] == 0) {
        uVar25 = (ulong)puVar21[(ulong)*(byte *)(*(long *)(puVar21 + 8) + 2 + lVar29 * 3) + 0x11];
        if (f->floor_types[uVar25] == 0) {
          f->error = VORBIS_invalid_stream;
        }
        else {
          psVar12 = f->finalY[lVar29];
          pFVar9 = f->floor_config;
          lVar35 = uVar25 * 0x63c;
          uVar30 = (uint)*(byte *)((long)pFVar9 + lVar35 + 0x634) * (int)*psVar12;
          uVar32 = 0;
          if (1 < *(int *)((long)pFVar9 + lVar35 + 0x638)) {
            uVar32 = 0;
            lVar22 = 1;
            uVar33 = (ulong)uVar30;
            do {
              uVar23 = (ulong)*(byte *)((long)pFVar9 + lVar22 + lVar35 + 0x346);
              iVar16 = (int)psVar12[uVar23];
              uVar34 = uVar33;
              if (-1 < iVar16) {
                uVar39 = (uint)(&pFVar9->floor1)[uVar25].floor1_multiplier * iVar16;
                uVar34 = (ulong)uVar39;
                uVar30 = (uint)*(ushort *)((long)pFVar9 + uVar23 * 2 + lVar35 + 0x152);
                iVar16 = (int)uVar32;
                iVar17 = uVar30 - iVar16;
                if (iVar17 != 0) {
                  iVar41 = uVar39 - (int)uVar33;
                  iVar27 = SDL_abs(iVar41);
                  iVar40 = SDL_abs((long)iVar41 / (long)iVar17 & 0xffffffff);
                  uVar13 = uVar18;
                  if ((int)uVar30 < (int)uVar18) {
                    uVar13 = uVar30;
                  }
                  if ((iVar16 < (int)uVar13) &&
                     (pfVar37[uVar32] = inverse_db_table[uVar33 & 0xff] * pfVar37[uVar32],
                     iVar16 + 1 < (int)uVar13)) {
                    iVar28 = 0;
                    lVar36 = 1;
                    do {
                      iVar28 = iVar28 + (iVar27 - iVar40 * iVar17);
                      uVar31 = 0;
                      iVar38 = 0;
                      if (iVar17 <= iVar28) {
                        uVar31 = iVar41 >> 0x1f | 1;
                        iVar38 = iVar17;
                      }
                      uVar31 = (int)uVar33 + (int)((long)iVar41 / (long)iVar17) + uVar31;
                      uVar33 = (ulong)uVar31;
                      iVar28 = iVar28 - iVar38;
                      pfVar37[uVar32 + lVar36] =
                           inverse_db_table[(byte)uVar31] * pfVar37[uVar32 + lVar36];
                      lVar36 = lVar36 + 1;
                    } while (uVar13 - iVar16 != (int)lVar36);
                  }
                  uVar32 = (ulong)uVar30;
                  uVar34 = (ulong)uVar39;
                }
              }
              uVar30 = (uint)uVar34;
              lVar22 = lVar22 + 1;
              uVar33 = uVar34;
            } while (lVar22 < (&pFVar9->floor1)[uVar25].values);
          }
          if ((int)uVar32 < (int)uVar18) {
            fVar45 = inverse_db_table[(int)uVar30];
            do {
              pfVar37[uVar32] = pfVar37[uVar32] * fVar45;
              uVar32 = uVar32 + 1;
            } while ((long)(int)uVar18 != uVar32);
          }
        }
      }
      else {
        SDL_memset(pfVar37,0,(long)(int)uVar18 * 4);
      }
      lVar29 = lVar29 + 1;
    } while (lVar29 < f->channels);
    if (0 < f->channels) {
      lVar29 = 0;
      do {
        inverse_mdct(f->channel_buffers[lVar29],iVar8,f,(uint)f->mode_config[lVar20].blockflag);
        lVar29 = lVar29 + 1;
      } while (lVar29 < f->channels);
    }
  }
  do {
    iVar16 = get8_packet_raw(f);
  } while (iVar16 != -1);
  if (f->first_decode == '\0') {
    iVar8 = f->discard_samples_deferred;
    if (iVar8 != 0) {
      if (iVar8 < iVar19 - iVar14) {
        *local_9c8 = iVar14 + iVar8;
        f->discard_samples_deferred = 0;
        iVar14 = iVar14 + iVar8;
      }
      else {
        f->discard_samples_deferred = iVar8 - (iVar19 - iVar14);
        *local_9c8 = iVar19;
        iVar14 = iVar19;
      }
    }
  }
  else {
    f->current_loc = -uVar18;
    f->discard_samples_deferred = iVar8 - local_9d0;
    f->current_loc_valid = 1;
    f->first_decode = '\0';
  }
  if (f->last_seg_which == f->end_seg_with_known_loc) {
    if ((f->current_loc_valid != 0) && ((f->page_flag & 4) != 0)) {
      uVar30 = f->current_loc;
      uVar39 = f->known_loc_for_packet;
      if (uVar39 < (local_9d0 - iVar14) + uVar30) {
        iVar19 = uVar39 - uVar30;
        if (uVar39 < uVar30) {
          iVar19 = 0;
        }
        iVar8 = iVar19 + iVar14;
        if (local_9d0 <= iVar19 + iVar14) {
          iVar8 = local_9d0;
        }
        *len = iVar8;
        f->current_loc = f->current_loc + iVar8;
        return 1;
      }
    }
    uVar15 = (iVar14 - uVar18) + f->known_loc_for_packet;
    f->current_loc_valid = 1;
  }
  else {
    if (f->current_loc_valid == 0) goto LAB_0011f1fd;
    uVar15 = f->current_loc;
  }
  f->current_loc = (iVar19 - iVar14) + uVar15;
LAB_0011f1fd:
  *len = local_9d0;
  return 1;
}

Assistant:

static int vorbis_decode_packet(vorb *f, int *len, int *p_left, int *p_right)
{
   int mode, left_end, right_end;
   if (!vorbis_decode_initial(f, p_left, &left_end, p_right, &right_end, &mode)) return 0;
   return vorbis_decode_packet_rest(f, len, f->mode_config + mode, *p_left, left_end, *p_right, right_end, p_left);
}